

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintFunctionMap.cpp
# Opt level: O0

void __thiscall wasm::PrintFunctionMap::run(PrintFunctionMap *this,Module *module)

{
  Module *wasm;
  string *defaultValue;
  anon_class_16_2_94731fc3 visitor;
  anon_class_16_2_94731fc3 visitor_00;
  anon_class_16_2_94731fc3 write;
  Index i;
  ostream *o;
  Output output;
  string local_90;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string outFile;
  Module *module_local;
  PrintFunctionMap *this_local;
  
  outFile.field_2._8_8_ = module;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"symbolmap",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"",(allocator<char> *)&output.field_0x30f);
  defaultValue = &local_90;
  Pass::getArgumentOrDefault((string *)local_38,&this->super_Pass,&local_58,defaultValue);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&output.field_0x30f);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  Output::Output((Output *)&o,(string *)local_38,Text);
  wasm = (Module *)Output::getStream((Output *)&o);
  write.i._4_4_ = 0;
  write.o = (ostream *)((long)&write.i + 4);
  visitor.i = (Index *)defaultValue;
  visitor.o = write.o;
  wasm::ModuleUtils::
  iterImportedFunctions<wasm::PrintFunctionMap::run(wasm::Module*)::_lambda(wasm::Function*)_1_>
            ((ModuleUtils *)outFile.field_2._8_8_,wasm,visitor);
  visitor_00.i = (Index *)defaultValue;
  visitor_00.o = write.o;
  wasm::ModuleUtils::
  iterDefinedFunctions<wasm::PrintFunctionMap::run(wasm::Module*)::_lambda(wasm::Function*)_1_>
            ((ModuleUtils *)outFile.field_2._8_8_,wasm,visitor_00);
  Output::~Output((Output *)&o);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void run(Module* module) override {
    // If an argument is provided, write to that file; otherwise write to
    // stdout.
    auto outFile = getArgumentOrDefault("symbolmap", "");
    Output output(outFile, Flags::Text);
    auto& o = output.getStream();
    Index i = 0;
    auto write = [&](Function* func) {
      o << i++ << ':' << func->name.str << '\n';
    };
    ModuleUtils::iterImportedFunctions(*module, write);
    ModuleUtils::iterDefinedFunctions(*module, write);
  }